

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_HTMLparser(void)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  htmlDocPtr pxVar30;
  size_t sVar31;
  long lVar32;
  htmlParserCtxtPtr pxVar33;
  xmlDocPtr pxVar34;
  ulong uVar35;
  undefined8 uVar36;
  char *pcVar37;
  undefined8 uVar38;
  int test_ret_2;
  uint uVar39;
  undefined4 *puVar40;
  int n_legacy;
  uint uVar41;
  ulong uVar42;
  undefined *puVar43;
  int test_ret_11;
  ulong uVar44;
  int test_ret_7;
  char *pcVar45;
  undefined8 *puVar46;
  int test_ret_14;
  uint uVar47;
  ulong *puVar48;
  int *piVar49;
  uint *puVar50;
  int n_name;
  uint uVar51;
  undefined4 uVar52;
  undefined8 uVar53;
  int test_ret_1;
  int test_ret;
  int test_ret_5;
  int test_ret_4;
  int test_ret_17;
  int test_ret_6;
  int test_ret_3;
  int local_84;
  undefined8 local_80;
  undefined8 local_78;
  int local_64;
  int local_44;
  undefined8 *local_38;
  
  if (quiet == '\0') {
    puts("Testing HTMLparser : 32 of 38 functions ...");
  }
  iVar1 = 0;
  uVar51 = 0;
  bVar4 = true;
  do {
    bVar3 = bVar4;
    uVar53 = 0;
    if (bVar3) {
      uVar53 = 0x168a14;
    }
    bVar4 = true;
    do {
      bVar2 = bVar4;
      iVar5 = xmlMemBlocks();
      uVar36 = 0;
      if (bVar2) {
        uVar36 = 0x168a1c;
      }
      UTF8ToHtml(0,uVar53,0,uVar36);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in UTF8ToHtml",(ulong)(uint)(iVar6 - iVar5));
        iVar1 = iVar1 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar51);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
      }
      bVar4 = false;
    } while (bVar2);
    uVar51 = 1;
    bVar4 = false;
  } while (bVar3);
  function_tests = function_tests + 1;
  local_84 = 0;
  uVar51 = 0;
  do {
    uVar41 = 0;
    puVar40 = &DAT_0016343c;
    do {
      iVar5 = xmlMemBlocks();
      if (uVar51 < 4) {
        uVar44 = (&DAT_00165d70)[uVar51];
      }
      else {
        uVar44 = 0;
      }
      htmlAttrAllowed(0,uVar44,*puVar40);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar5 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlAttrAllowed",(ulong)(uint)(iVar6 - iVar5));
        local_84 = local_84 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar51);
        uVar44 = (ulong)uVar41;
        printf(" %d");
        putchar(10);
      }
      uVar41 = uVar41 + 1;
      puVar40 = puVar40 + 1;
    } while (uVar41 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar51 = 0;
  do {
    puVar48 = &DAT_00165d70;
    uVar41 = 0;
    do {
      iVar7 = (int)uVar44;
      iVar6 = xmlMemBlocks();
      pxVar30 = gen_htmlDocPtr(uVar51,iVar7);
      if (uVar41 < 4) {
        uVar44 = *puVar48;
      }
      else {
        uVar44 = 0;
      }
      htmlAutoCloseTag(pxVar30,uVar44,0);
      call_tests = call_tests + 1;
      if (((pxVar30 != (htmlDocPtr)0x0) && (api_doc != pxVar30)) && (pxVar30->doc != api_doc)) {
        xmlFreeDoc(pxVar30);
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlAutoCloseTag",(ulong)(uint)(iVar7 - iVar6));
        iVar5 = iVar5 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        uVar44 = 0;
        printf(" %d");
        putchar(10);
      }
      uVar41 = uVar41 + 1;
      puVar48 = puVar48 + 1;
    } while (uVar41 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar51 = 0;
  do {
    piVar49 = &DAT_0016343c;
    uVar41 = 0;
    do {
      iVar7 = xmlMemBlocks();
      if (uVar51 == 0) {
        bVar4 = false;
        pcVar45 = "foo";
      }
      else if (uVar51 == 2) {
        bVar4 = false;
        pcVar45 = "test/ent2";
      }
      else if (uVar51 == 1) {
        bVar4 = false;
        pcVar45 = "<foo/>";
      }
      else {
        bVar4 = true;
        pcVar45 = (char *)0x0;
      }
      iVar8 = *piVar49;
      if ((bVar4) || (sVar31 = strlen(pcVar45), iVar8 <= (int)sVar31 + 1)) {
        lVar32 = htmlCreateMemoryParserCtxt(pcVar45,iVar8);
        if (lVar32 != 0) {
          htmlFreeParserCtxt(lVar32);
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlCreateMemoryParserCtxt",
                 (ulong)(uint)(iVar8 - iVar7));
          iVar6 = iVar6 + 1;
          printf(" %d",(ulong)uVar51);
          printf(" %d",(ulong)uVar41);
          putchar(10);
        }
      }
      uVar41 = uVar41 + 1;
      piVar49 = piVar49 + 1;
    } while (uVar41 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  local_64 = 0;
  iVar7 = 0;
  do {
    uVar51 = 0;
    do {
      uVar41 = 0;
      do {
        uVar44 = 0;
        do {
          piVar49 = (int *)0x0;
          puVar40 = &DAT_00155228;
          do {
            uVar47 = (uint)piVar49;
            iVar8 = xmlMemBlocks();
            pcVar45 = (char *)&call_tests;
            if (iVar7 != 0) {
              if (iVar7 == 1) {
                pcVar45 = (char *)0xffffffffffffffff;
              }
              else {
                pcVar45 = (char *)0x0;
              }
            }
            if (uVar51 == 0) {
              bVar4 = false;
              pcVar37 = "foo";
            }
            else if (uVar51 == 2) {
              bVar4 = false;
              pcVar37 = "test/ent2";
            }
            else if (uVar51 == 1) {
              bVar4 = false;
              pcVar37 = "<foo/>";
            }
            else {
              bVar4 = true;
              pcVar37 = (char *)0x0;
            }
            iVar9 = -1;
            if (uVar41 < 4) {
              iVar9 = (&DAT_0016343c)[uVar41];
            }
            if ((uint)uVar44 < 5) {
              puVar43 = (&PTR_anon_var_dwarf_658_00165d30)[uVar44];
            }
            else {
              puVar43 = (undefined *)0x0;
            }
            uVar52 = 0xffffffff;
            if (uVar47 < 3) {
              uVar52 = *puVar40;
            }
            if ((bVar4) || (sVar31 = strlen(pcVar37), iVar9 <= (int)sVar31 + 1)) {
              lVar32 = htmlCreatePushParserCtxt(0,pcVar45,pcVar37,iVar9,puVar43,uVar52);
              if (lVar32 != 0) {
                htmlFreeParserCtxt(lVar32);
              }
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar9 = xmlMemBlocks();
              if (iVar8 != iVar9) {
                iVar9 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlCreatePushParserCtxt",
                       (ulong)(uint)(iVar9 - iVar8));
                local_64 = local_64 + 1;
                printf(" %d",0);
                printf(" %d",iVar7);
                printf(" %d",(ulong)uVar51);
                printf(" %d",(ulong)uVar41);
                printf(" %d",uVar44);
                printf(" %d");
                putchar(10);
                pcVar45 = (char *)piVar49;
              }
            }
            uVar47 = uVar47 + 1;
            piVar49 = (int *)(ulong)uVar47;
            puVar40 = puVar40 + 1;
          } while (uVar47 != 4);
          uVar47 = (uint)uVar44 + 1;
          uVar44 = (ulong)uVar47;
        } while (uVar47 != 6);
        uVar41 = uVar41 + 1;
      } while (uVar41 != 4);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 4);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 3);
  function_tests = function_tests + 1;
  local_38 = &DAT_00165d70;
  iVar7 = 0;
  uVar51 = 0;
  do {
    uVar41 = 0;
    do {
      uVar47 = 0;
      do {
        uVar44 = 0;
        do {
          piVar49 = (int *)0x0;
          puVar40 = &DAT_0016343c;
          do {
            iVar9 = (int)pcVar45;
            iVar8 = xmlMemBlocks();
            pxVar33 = gen_htmlParserCtxtPtr(uVar51,iVar9);
            if (uVar41 < 4) {
              pcVar45 = (char *)(&DAT_00165d70)[uVar41];
            }
            else {
              pcVar45 = (char *)0x0;
            }
            if (uVar47 < 7) {
              uVar53 = (&DAT_00165d90)[uVar47];
            }
            else {
              uVar53 = 0;
            }
            if ((uint)uVar44 < 3) {
              uVar36 = (&DAT_00165d58)[uVar44];
            }
            else {
              uVar36 = 0;
            }
            pxVar34 = (xmlDocPtr)htmlCtxtReadDoc(pxVar33,pcVar45,uVar53,uVar36,*puVar40);
            if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc))
            {
              xmlFreeDoc(pxVar34);
            }
            call_tests = call_tests + 1;
            if (pxVar33 != (htmlParserCtxtPtr)0x0) {
              htmlFreeParserCtxt(pxVar33);
            }
            xmlResetLastError();
            iVar9 = xmlMemBlocks();
            iVar10 = (int)piVar49;
            if (iVar8 != iVar9) {
              iVar9 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlCtxtReadDoc",(ulong)(uint)(iVar9 - iVar8));
              iVar7 = iVar7 + 1;
              printf(" %d",(ulong)uVar51);
              printf(" %d",(ulong)uVar41);
              printf(" %d",(ulong)uVar47);
              printf(" %d",uVar44);
              printf(" %d");
              putchar(10);
              pcVar45 = (char *)piVar49;
            }
            uVar39 = iVar10 + 1;
            piVar49 = (int *)(ulong)uVar39;
            puVar40 = puVar40 + 1;
          } while (uVar39 != 4);
          uVar39 = (uint)uVar44 + 1;
          uVar44 = (ulong)uVar39;
        } while (uVar39 != 4);
        uVar47 = uVar47 + 1;
      } while (uVar47 != 8);
      uVar41 = uVar41 + 1;
    } while (uVar41 != 5);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar8 = 0;
  do {
    uVar51 = 0;
    do {
      uVar41 = 0;
      do {
        lVar32 = 0;
        do {
          pxVar33 = gen_htmlParserCtxtPtr(iVar8,(int)pcVar45);
          if (uVar51 < 7) {
            pcVar45 = (char *)(&DAT_00165d90)[uVar51];
          }
          else {
            pcVar45 = (char *)0x0;
          }
          if (uVar41 < 3) {
            uVar53 = (&DAT_00165d58)[uVar41];
          }
          else {
            uVar53 = 0;
          }
          pxVar34 = (xmlDocPtr)
                    htmlCtxtReadFile(pxVar33,pcVar45,uVar53,
                                     *(undefined4 *)((long)&DAT_0016343c + lVar32));
          if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
            xmlFreeDoc(pxVar34);
          }
          call_tests = call_tests + 1;
          if (pxVar33 != (htmlParserCtxtPtr)0x0) {
            htmlFreeParserCtxt(pxVar33);
          }
          xmlResetLastError();
          lVar32 = lVar32 + 4;
        } while ((int)lVar32 != 0x10);
        uVar41 = uVar41 + 1;
      } while (uVar41 != 4);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 8);
    iVar8 = iVar8 + 1;
  } while (iVar8 != 3);
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar51 = 0;
  do {
    iVar8 = 0;
    do {
      uVar41 = 0;
      do {
        uVar44 = 0;
        do {
          uVar35 = 0;
          do {
            puVar40 = &DAT_0016343c;
            uVar47 = 0;
            do {
              iVar10 = (int)pcVar45;
              iVar9 = xmlMemBlocks();
              pxVar33 = gen_htmlParserCtxtPtr(uVar51,iVar10);
              if (iVar8 == 0) {
                bVar4 = false;
                pcVar45 = "foo";
              }
              else if (iVar8 == 2) {
                bVar4 = false;
                pcVar45 = "test/ent2";
              }
              else if (iVar8 == 1) {
                bVar4 = false;
                pcVar45 = "<foo/>";
              }
              else {
                bVar4 = true;
                pcVar45 = (char *)0x0;
              }
              iVar10 = -1;
              if (uVar41 < 4) {
                iVar10 = (&DAT_0016343c)[uVar41];
              }
              if ((uint)uVar44 < 7) {
                uVar53 = (&DAT_00165d90)[uVar44];
              }
              else {
                uVar53 = 0;
              }
              if ((uint)uVar35 < 3) {
                uVar36 = (&DAT_00165d58)[uVar35];
              }
              else {
                uVar36 = 0;
              }
              uVar52 = *puVar40;
              if ((bVar4) || (sVar31 = strlen(pcVar45), iVar10 <= (int)sVar31 + 1)) {
                pxVar34 = (xmlDocPtr)htmlCtxtReadMemory(pxVar33,pcVar45,iVar10,uVar53,uVar36,uVar52)
                ;
                if ((pxVar34 != (xmlDocPtr)0x0) &&
                   ((api_doc != pxVar34 && (pxVar34->doc != api_doc)))) {
                  xmlFreeDoc(pxVar34);
                }
                call_tests = call_tests + 1;
                if (pxVar33 != (htmlParserCtxtPtr)0x0) {
                  htmlFreeParserCtxt(pxVar33);
                }
                xmlResetLastError();
                iVar10 = xmlMemBlocks();
                if (iVar9 != iVar10) {
                  iVar10 = xmlMemBlocks();
                  printf("Leak of %d blocks found in htmlCtxtReadMemory",
                         (ulong)(uint)(iVar10 - iVar9));
                  local_44 = local_44 + 1;
                  printf(" %d",(ulong)uVar51);
                  printf(" %d",iVar8);
                  printf(" %d",(ulong)uVar41);
                  printf(" %d",uVar44);
                  printf(" %d",uVar35);
                  pcVar45 = (char *)(ulong)uVar47;
                  printf(" %d");
                  putchar(10);
                }
              }
              uVar47 = uVar47 + 1;
              puVar40 = puVar40 + 1;
            } while (uVar47 != 4);
            uVar47 = (uint)uVar35 + 1;
            uVar35 = (ulong)uVar47;
          } while (uVar47 != 4);
          uVar47 = (uint)uVar44 + 1;
          uVar44 = (ulong)uVar47;
        } while (uVar47 != 8);
        uVar41 = uVar41 + 1;
      } while (uVar41 != 4);
      iVar8 = iVar8 + 1;
    } while (iVar8 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar8 = 0;
  do {
    iVar9 = xmlMemBlocks();
    pxVar33 = gen_htmlParserCtxtPtr(uVar51,(int)pcVar45);
    htmlCtxtReset(pxVar33);
    call_tests = call_tests + 1;
    if (pxVar33 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar33);
    }
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlCtxtReset",(ulong)(uint)(iVar10 - iVar9));
      iVar8 = iVar8 + 1;
      pcVar45 = (char *)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar9 = 0;
  uVar51 = 0;
  do {
    puVar50 = &DAT_0016343c;
    piVar49 = (int *)0x0;
    do {
      iVar11 = (int)pcVar45;
      iVar10 = xmlMemBlocks();
      pxVar33 = gen_htmlParserCtxtPtr(uVar51,iVar11);
      pcVar45 = (char *)(ulong)*puVar50;
      htmlCtxtUseOptions(pxVar33);
      call_tests = call_tests + 1;
      if (pxVar33 != (htmlParserCtxtPtr)0x0) {
        htmlFreeParserCtxt(pxVar33);
      }
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      iVar12 = (int)piVar49;
      if (iVar10 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCtxtUseOptions",(ulong)(uint)(iVar11 - iVar10));
        iVar9 = iVar9 + 1;
        printf(" %d",(ulong)uVar51);
        printf(" %d");
        putchar(10);
        pcVar45 = (char *)piVar49;
      }
      uVar41 = iVar12 + 1;
      piVar49 = (int *)(ulong)uVar41;
      puVar50 = puVar50 + 1;
    } while (uVar41 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar10 = 0;
  do {
    iVar11 = xmlMemBlocks();
    if (uVar51 < 4) {
      uVar53 = *local_38;
    }
    else {
      uVar53 = 0;
    }
    htmlElementAllowedHere(0,uVar53);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlElementAllowedHere",(ulong)(uint)(iVar12 - iVar11));
      iVar10 = iVar10 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
    local_38 = local_38 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  iVar11 = xmlMemBlocks();
  htmlElementStatusHere(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar12 = xmlMemBlocks();
  if (iVar11 != iVar12) {
    iVar13 = xmlMemBlocks();
    printf("Leak of %d blocks found in htmlElementStatusHere",(ulong)(uint)(iVar13 - iVar11));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar13 = 0;
  local_80 = 0;
  bVar4 = true;
  do {
    bVar3 = bVar4;
    local_78 = 0;
    uVar44 = 0;
    if (bVar3) {
      uVar44 = 0x168a14;
    }
    bVar4 = true;
    do {
      bVar2 = bVar4;
      uVar53 = 0;
      if (bVar2) {
        uVar53 = 0x168a1c;
      }
      puVar40 = &DAT_0016343c;
      uVar35 = 0;
      do {
        iVar14 = xmlMemBlocks();
        uVar42 = uVar44;
        htmlEncodeEntities(0,uVar44,0,uVar53,*puVar40);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar15 = xmlMemBlocks();
        iVar16 = (int)uVar35;
        if (iVar14 != iVar15) {
          iVar15 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlEncodeEntities",(ulong)(uint)(iVar15 - iVar14));
          iVar13 = iVar13 + 1;
          printf(" %d",0);
          printf(" %d",local_80);
          printf(" %d",0);
          printf(" %d",local_78);
          printf(" %d");
          putchar(10);
          uVar42 = uVar35;
        }
        uVar51 = iVar16 + 1;
        uVar35 = (ulong)uVar51;
        puVar40 = puVar40 + 1;
      } while (uVar51 != 4);
      local_78 = 1;
      bVar4 = false;
    } while (bVar2);
    local_80 = 1;
    bVar4 = false;
  } while (bVar3);
  function_tests = function_tests + 1;
  puVar46 = &DAT_00165d70;
  uVar51 = 0;
  iVar14 = 0;
  do {
    iVar15 = xmlMemBlocks();
    if (uVar51 < 4) {
      uVar53 = *puVar46;
    }
    else {
      uVar53 = 0;
    }
    htmlEntityLookup(uVar53);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityLookup",(ulong)(uint)(iVar16 - iVar15));
      iVar14 = iVar14 + 1;
      uVar42 = (ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
    puVar46 = puVar46 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  puVar40 = &DAT_001551ec;
  uVar51 = 0;
  iVar15 = 0;
  do {
    iVar16 = xmlMemBlocks();
    htmlEntityValueLookup(*puVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar17 = xmlMemBlocks();
    if (iVar16 != iVar17) {
      iVar17 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityValueLookup",(ulong)(uint)(iVar17 - iVar16));
      iVar15 = iVar15 + 1;
      uVar42 = (ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
    puVar40 = puVar40 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  puVar40 = &DAT_0016343c;
  uVar51 = 0;
  iVar16 = 0;
  do {
    iVar17 = xmlMemBlocks();
    htmlHandleOmittedElem(*puVar40);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlHandleOmittedElem",(ulong)(uint)(iVar18 - iVar17));
      iVar16 = iVar16 + 1;
      uVar42 = (ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
    puVar40 = puVar40 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  iVar17 = 0;
  iVar18 = 0;
  do {
    iVar20 = (int)uVar42;
    iVar19 = xmlMemBlocks();
    pxVar30 = gen_htmlDocPtr(iVar18,iVar20);
    uVar42 = 0;
    htmlIsAutoClosed(pxVar30);
    call_tests = call_tests + 1;
    if (((pxVar30 != (htmlDocPtr)0x0) && (api_doc != pxVar30)) && (pxVar30->doc != api_doc)) {
      xmlFreeDoc(pxVar30);
    }
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsAutoClosed",(ulong)(uint)(iVar20 - iVar19));
      iVar17 = iVar17 + 1;
      printf(" %d");
      uVar42 = 0;
      printf(" %d");
      putchar(10);
    }
    iVar18 = iVar18 + 1;
  } while (iVar18 != 3);
  function_tests = function_tests + 1;
  puVar46 = &DAT_00165d70;
  uVar51 = 0;
  iVar18 = 0;
  do {
    iVar19 = xmlMemBlocks();
    if (uVar51 < 4) {
      uVar53 = *puVar46;
    }
    else {
      uVar53 = 0;
    }
    htmlIsScriptAttribute(uVar53);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar20 = xmlMemBlocks();
    if (iVar19 != iVar20) {
      iVar20 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsScriptAttribute",(ulong)(uint)(iVar20 - iVar19));
      iVar18 = iVar18 + 1;
      printf(" %d",(ulong)uVar51);
      putchar(10);
    }
    uVar51 = uVar51 + 1;
    puVar46 = puVar46 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  iVar19 = xmlMemBlocks();
  lVar32 = htmlNewParserCtxt();
  if (lVar32 != 0) {
    htmlFreeParserCtxt(lVar32);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar20 = xmlMemBlocks();
  if (iVar19 != iVar20) {
    iVar21 = xmlMemBlocks();
    printf("Leak of %d blocks found in htmlNewParserCtxt",(ulong)(uint)(iVar21 - iVar19));
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar50 = &DAT_0016343c;
  pcVar45 = (char *)0x0;
  iVar21 = 0;
  do {
    iVar22 = xmlMemBlocks();
    pcVar37 = (char *)(ulong)*puVar50;
    htmlNodeStatus(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar23 = xmlMemBlocks();
    iVar24 = (int)pcVar45;
    if (iVar22 != iVar23) {
      iVar23 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlNodeStatus",(ulong)(uint)(iVar23 - iVar22));
      iVar21 = iVar21 + 1;
      printf(" %d",0);
      printf(" %d");
      putchar(10);
      pcVar37 = pcVar45;
    }
    uVar51 = iVar24 + 1;
    pcVar45 = (char *)(ulong)uVar51;
    puVar50 = puVar50 + 1;
  } while (uVar51 != 4);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar22 = 0;
  do {
    iVar23 = xmlMemBlocks();
    pxVar33 = gen_htmlParserCtxtPtr(uVar51,(int)pcVar37);
    htmlParseCharRef(pxVar33);
    call_tests = call_tests + 1;
    if (pxVar33 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar33);
    }
    xmlResetLastError();
    iVar24 = xmlMemBlocks();
    if (iVar23 != iVar24) {
      iVar24 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseCharRef",(ulong)(uint)(iVar24 - iVar23));
      iVar22 = iVar22 + 1;
      pcVar37 = (char *)(ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar23 = 0;
  uVar51 = 0;
  do {
    iVar24 = 0;
    do {
      uVar44 = 0;
      do {
        puVar40 = &DAT_0016343c;
        uVar41 = 0;
        do {
          iVar25 = xmlMemBlocks();
          pxVar33 = gen_htmlParserCtxtPtr(uVar51,(int)pcVar37);
          if (iVar24 == 0) {
            bVar4 = false;
            pcVar45 = "foo";
          }
          else if (iVar24 == 2) {
            bVar4 = false;
            pcVar45 = "test/ent2";
          }
          else if (iVar24 == 1) {
            bVar4 = false;
            pcVar45 = "<foo/>";
          }
          else {
            bVar4 = true;
            pcVar45 = (char *)0x0;
          }
          iVar26 = -1;
          if ((uint)uVar44 < 4) {
            iVar26 = (&DAT_0016343c)[uVar44];
          }
          uVar52 = *puVar40;
          if ((bVar4) || (sVar31 = strlen(pcVar45), iVar26 <= (int)sVar31 + 1)) {
            htmlParseChunk(pxVar33,pcVar45,iVar26,uVar52);
            if (pxVar33 == (htmlParserCtxtPtr)0x0) {
              call_tests = call_tests + 1;
              pcVar37 = pcVar45;
            }
            else {
              xmlFreeDoc(pxVar33->myDoc);
              pxVar33->myDoc = (xmlDocPtr)0x0;
              call_tests = call_tests + 1;
              htmlFreeParserCtxt(pxVar33);
              pcVar37 = pcVar45;
            }
            xmlResetLastError();
            iVar26 = xmlMemBlocks();
            if (iVar25 != iVar26) {
              iVar26 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlParseChunk",(ulong)(uint)(iVar26 - iVar25));
              iVar23 = iVar23 + 1;
              printf(" %d",(ulong)uVar51);
              printf(" %d",iVar24);
              printf(" %d",uVar44);
              pcVar37 = (char *)(ulong)uVar41;
              printf(" %d");
              putchar(10);
            }
          }
          uVar41 = uVar41 + 1;
          puVar40 = puVar40 + 1;
        } while (uVar41 != 4);
        uVar41 = (uint)uVar44 + 1;
        uVar44 = (ulong)uVar41;
      } while (uVar41 != 4);
      iVar24 = iVar24 + 1;
    } while (iVar24 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar24 = 0;
  uVar51 = 0;
  do {
    puVar48 = &DAT_00165d58;
    uVar41 = 0;
    do {
      iVar25 = xmlMemBlocks();
      if (uVar51 < 4) {
        uVar53 = (&DAT_00165d70)[uVar51];
      }
      else {
        uVar53 = 0;
      }
      if (uVar41 < 3) {
        uVar44 = *puVar48;
      }
      else {
        uVar44 = 0;
      }
      pxVar34 = (xmlDocPtr)htmlParseDoc(uVar53);
      if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
        xmlFreeDoc();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar26 = xmlMemBlocks();
      if (iVar25 != iVar26) {
        iVar26 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlParseDoc",(ulong)(uint)(iVar26 - iVar25));
        iVar24 = iVar24 + 1;
        printf(" %d",(ulong)uVar51);
        uVar44 = (ulong)uVar41;
        printf(" %d");
        putchar(10);
      }
      uVar41 = uVar41 + 1;
      puVar48 = puVar48 + 1;
    } while (uVar41 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  uVar51 = 0;
  local_78._0_4_ = 0;
  do {
    iVar25 = xmlMemBlocks();
    pxVar33 = gen_htmlParserCtxtPtr(uVar51,(int)uVar44);
    htmlParseDocument(pxVar33);
    if (pxVar33 == (htmlParserCtxtPtr)0x0) {
      call_tests = call_tests + 1;
    }
    else {
      xmlFreeDoc(pxVar33->myDoc);
      pxVar33->myDoc = (xmlDocPtr)0x0;
      call_tests = call_tests + 1;
      htmlFreeParserCtxt(pxVar33);
    }
    xmlResetLastError();
    iVar26 = xmlMemBlocks();
    if (iVar25 != iVar26) {
      iVar26 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseDocument",(ulong)(uint)(iVar26 - iVar25));
      local_78._0_4_ = (int)local_78 + 1;
      uVar44 = (ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  uVar51 = 0;
  iVar25 = 0;
  do {
    iVar26 = xmlMemBlocks();
    pxVar33 = gen_htmlParserCtxtPtr(uVar51,(int)uVar44);
    htmlParseElement(pxVar33);
    call_tests = call_tests + 1;
    if (pxVar33 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt(pxVar33);
    }
    xmlResetLastError();
    iVar27 = xmlMemBlocks();
    if (iVar26 != iVar27) {
      iVar27 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseElement",(ulong)(uint)(iVar27 - iVar26));
      iVar25 = iVar25 + 1;
      uVar44 = (ulong)uVar51;
      printf(" %d");
      putchar(10);
    }
    uVar51 = uVar51 + 1;
  } while (uVar51 != 3);
  function_tests = function_tests + 1;
  iVar27 = 0;
  iVar26 = 0;
  do {
    iVar29 = (int)uVar44;
    iVar28 = xmlMemBlocks();
    pxVar33 = gen_htmlParserCtxtPtr(iVar26,iVar29);
    uVar44 = 0;
    htmlParseEntityRef();
    call_tests = call_tests + 1;
    if (pxVar33 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar29 = xmlMemBlocks();
    if (iVar28 != iVar29) {
      iVar29 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseEntityRef",(ulong)(uint)(iVar29 - iVar28));
      iVar27 = iVar27 + 1;
      printf(" %d");
      uVar44 = 0;
      printf(" %d");
      putchar(10);
    }
    iVar26 = iVar26 + 1;
  } while (iVar26 != 3);
  function_tests = function_tests + 1;
  iVar1 = local_84 + iVar1 + iVar5 + iVar6 + local_64 + iVar7 + local_44 + iVar8 + iVar9 + iVar10 +
          (uint)(iVar11 != iVar12) + iVar13 + iVar14 + iVar15 + iVar16 + iVar17 + iVar18 +
          (uint)(iVar19 != iVar20) + iVar21 + iVar22 + iVar23 + iVar24 + (int)local_78;
  uVar51 = 0;
  do {
    puVar46 = &DAT_00165d58;
    uVar41 = 0;
    do {
      if (uVar51 < 7) {
        uVar53 = (&DAT_00165d90)[uVar51];
      }
      else {
        uVar53 = 0;
      }
      if (uVar41 < 3) {
        uVar36 = *puVar46;
      }
      else {
        uVar36 = 0;
      }
      pxVar34 = (xmlDocPtr)htmlParseFile(uVar53,uVar36);
      if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
        xmlFreeDoc();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      uVar41 = uVar41 + 1;
      puVar46 = puVar46 + 1;
    } while (uVar41 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 8);
  function_tests = function_tests + 1;
  local_78._0_4_ = 0;
  uVar51 = 0;
  do {
    uVar44 = 0;
    do {
      uVar41 = 0;
      do {
        puVar40 = &DAT_0016343c;
        iVar5 = 0;
        do {
          iVar6 = xmlMemBlocks();
          if (uVar51 < 4) {
            uVar53 = (&DAT_00165d70)[uVar51];
          }
          else {
            uVar53 = 0;
          }
          if ((uint)uVar44 < 7) {
            uVar36 = (&DAT_00165d90)[uVar44];
          }
          else {
            uVar36 = 0;
          }
          if (uVar41 < 3) {
            uVar38 = (&DAT_00165d58)[uVar41];
          }
          else {
            uVar38 = 0;
          }
          pxVar34 = (xmlDocPtr)htmlReadDoc(uVar53,uVar36,uVar38,*puVar40);
          if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
            xmlFreeDoc();
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlReadDoc",(ulong)(uint)(iVar7 - iVar6));
            local_78._0_4_ = (int)local_78 + 1;
            printf(" %d",(ulong)uVar51);
            printf(" %d",uVar44);
            printf(" %d",(ulong)uVar41);
            printf(" %d");
            putchar(10);
          }
          iVar5 = iVar5 + 1;
          puVar40 = puVar40 + 1;
        } while (iVar5 != 4);
        uVar41 = uVar41 + 1;
      } while (uVar41 != 4);
      uVar41 = (uint)uVar44 + 1;
      uVar44 = (ulong)uVar41;
    } while (uVar41 != 8);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar51 = 0;
  do {
    uVar44 = 0;
    do {
      iVar6 = 0;
      puVar40 = &DAT_0016343c;
      do {
        iVar7 = xmlMemBlocks();
        if (uVar51 < 7) {
          uVar53 = (&DAT_00165d90)[uVar51];
        }
        else {
          uVar53 = 0;
        }
        if ((uint)uVar44 < 3) {
          uVar36 = (&DAT_00165d58)[uVar44];
        }
        else {
          uVar36 = 0;
        }
        pxVar34 = (xmlDocPtr)htmlReadFile(uVar53,uVar36,*puVar40);
        if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
          xmlFreeDoc();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlReadFile",(ulong)(uint)(iVar8 - iVar7));
          iVar5 = iVar5 + 1;
          printf(" %d",(ulong)uVar51);
          printf(" %d",uVar44);
          printf(" %d");
          putchar(10);
        }
        iVar6 = iVar6 + 1;
        puVar40 = puVar40 + 1;
      } while (iVar6 != 4);
      uVar41 = (uint)uVar44 + 1;
      uVar44 = (ulong)uVar41;
    } while (uVar41 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 8);
  function_tests = function_tests + 1;
  local_64 = 0;
  iVar6 = 0;
  do {
    uVar51 = 0;
    do {
      uVar41 = 0;
      do {
        uVar44 = 0;
        do {
          uVar35 = 0;
          puVar40 = &DAT_0016343c;
          do {
            iVar7 = xmlMemBlocks();
            if (iVar6 == 0) {
              bVar4 = false;
              pcVar45 = "foo";
            }
            else if (iVar6 == 2) {
              bVar4 = false;
              pcVar45 = "test/ent2";
            }
            else if (iVar6 == 1) {
              bVar4 = false;
              pcVar45 = "<foo/>";
            }
            else {
              bVar4 = true;
              pcVar45 = (char *)0x0;
            }
            iVar8 = -1;
            if (uVar51 < 4) {
              iVar8 = (&DAT_0016343c)[uVar51];
            }
            if (uVar41 < 7) {
              uVar53 = (&DAT_00165d90)[uVar41];
            }
            else {
              uVar53 = 0;
            }
            if ((uint)uVar44 < 3) {
              uVar36 = (&DAT_00165d58)[uVar44];
            }
            else {
              uVar36 = 0;
            }
            uVar52 = *puVar40;
            if ((bVar4) || (sVar31 = strlen(pcVar45), iVar8 <= (int)sVar31 + 1)) {
              pxVar34 = (xmlDocPtr)htmlReadMemory(pcVar45,iVar8,uVar53,uVar36,uVar52);
              if ((pxVar34 != (xmlDocPtr)0x0) && ((api_doc != pxVar34 && (pxVar34->doc != api_doc)))
                 ) {
                xmlFreeDoc();
              }
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar8 = xmlMemBlocks();
              if (iVar7 != iVar8) {
                iVar8 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlReadMemory",(ulong)(uint)(iVar8 - iVar7));
                local_64 = local_64 + 1;
                printf(" %d",iVar6);
                printf(" %d",(ulong)uVar51);
                printf(" %d",(ulong)uVar41);
                printf(" %d",uVar44);
                printf(" %d",uVar35);
                putchar(10);
              }
            }
            uVar47 = (int)uVar35 + 1;
            uVar35 = (ulong)uVar47;
            puVar40 = puVar40 + 1;
          } while (uVar47 != 4);
          uVar47 = (uint)uVar44 + 1;
          uVar44 = (ulong)uVar47;
        } while (uVar47 != 4);
        uVar41 = uVar41 + 1;
      } while (uVar41 != 8);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 4);
    iVar6 = iVar6 + 1;
  } while (iVar6 != 4);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar51 = 0;
  do {
    uVar44 = 0;
    do {
      iVar7 = 0;
      do {
        iVar8 = xmlMemBlocks();
        if (uVar51 < 4) {
          uVar53 = (&DAT_00165d70)[uVar51];
        }
        else {
          uVar53 = 0;
        }
        if ((uint)uVar44 < 3) {
          uVar36 = (&DAT_00165d58)[uVar44];
        }
        else {
          uVar36 = 0;
        }
        piVar49 = &call_tests;
        if (iVar7 != 0) {
          if (iVar7 == 1) {
            piVar49 = (int *)0xffffffffffffffff;
          }
          else {
            piVar49 = (int *)0x0;
          }
        }
        pxVar34 = (xmlDocPtr)htmlSAXParseDoc(uVar53,uVar36,0,piVar49);
        if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
          xmlFreeDoc();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar9 = xmlMemBlocks();
        if (iVar8 != iVar9) {
          iVar9 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlSAXParseDoc",(ulong)(uint)(iVar9 - iVar8));
          iVar6 = iVar6 + 1;
          printf(" %d",(ulong)uVar51);
          printf(" %d",uVar44);
          printf(" %d",0);
          printf(" %d");
          putchar(10);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != 3);
      uVar41 = (uint)uVar44 + 1;
      uVar44 = (ulong)uVar41;
    } while (uVar41 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 5);
  function_tests = function_tests + 1;
  iVar7 = 0;
  uVar51 = 0;
  do {
    uVar44 = 0;
    do {
      iVar8 = 0;
      do {
        iVar9 = xmlMemBlocks();
        if (uVar51 < 7) {
          uVar53 = (&DAT_00165d90)[uVar51];
        }
        else {
          uVar53 = 0;
        }
        if ((uint)uVar44 < 3) {
          uVar36 = (&DAT_00165d58)[uVar44];
        }
        else {
          uVar36 = 0;
        }
        piVar49 = &call_tests;
        if (iVar8 != 0) {
          if (iVar8 == 1) {
            piVar49 = (int *)0xffffffffffffffff;
          }
          else {
            piVar49 = (int *)0x0;
          }
        }
        pxVar34 = (xmlDocPtr)htmlSAXParseFile(uVar53,uVar36,0,piVar49);
        if (((pxVar34 != (xmlDocPtr)0x0) && (api_doc != pxVar34)) && (pxVar34->doc != api_doc)) {
          xmlFreeDoc();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar10 = xmlMemBlocks();
        if (iVar9 != iVar10) {
          iVar10 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlSAXParseFile",(ulong)(uint)(iVar10 - iVar9));
          iVar7 = iVar7 + 1;
          printf(" %d",(ulong)uVar51);
          printf(" %d",uVar44);
          printf(" %d",0);
          printf(" %d");
          putchar(10);
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 != 3);
      uVar41 = (uint)uVar44 + 1;
      uVar44 = (ulong)uVar41;
    } while (uVar41 != 4);
    uVar51 = uVar51 + 1;
  } while (uVar51 != 8);
  function_tests = function_tests + 1;
  uVar51 = iVar1 + iVar25 + iVar27 + (int)local_78 + iVar5 + local_64 + iVar6 + iVar7;
  if (uVar51 != 0) {
    printf("Module HTMLparser: %d errors\n",(ulong)uVar51);
  }
  return uVar51;
}

Assistant:

static int
test_HTMLparser(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing HTMLparser : 32 of 38 functions ...\n");
    test_ret += test_UTF8ToHtml();
    test_ret += test_htmlAttrAllowed();
    test_ret += test_htmlAutoCloseTag();
    test_ret += test_htmlCreateMemoryParserCtxt();
    test_ret += test_htmlCreatePushParserCtxt();
    test_ret += test_htmlCtxtReadDoc();
    test_ret += test_htmlCtxtReadFile();
    test_ret += test_htmlCtxtReadMemory();
    test_ret += test_htmlCtxtReset();
    test_ret += test_htmlCtxtUseOptions();
    test_ret += test_htmlElementAllowedHere();
    test_ret += test_htmlElementStatusHere();
    test_ret += test_htmlEncodeEntities();
    test_ret += test_htmlEntityLookup();
    test_ret += test_htmlEntityValueLookup();
    test_ret += test_htmlHandleOmittedElem();
    test_ret += test_htmlIsAutoClosed();
    test_ret += test_htmlIsScriptAttribute();
    test_ret += test_htmlNewParserCtxt();
    test_ret += test_htmlNodeStatus();
    test_ret += test_htmlParseCharRef();
    test_ret += test_htmlParseChunk();
    test_ret += test_htmlParseDoc();
    test_ret += test_htmlParseDocument();
    test_ret += test_htmlParseElement();
    test_ret += test_htmlParseEntityRef();
    test_ret += test_htmlParseFile();
    test_ret += test_htmlReadDoc();
    test_ret += test_htmlReadFile();
    test_ret += test_htmlReadMemory();
    test_ret += test_htmlSAXParseDoc();
    test_ret += test_htmlSAXParseFile();
    test_ret += test_htmlTagLookup();

    if (test_ret != 0)
	printf("Module HTMLparser: %d errors\n", test_ret);
    return(test_ret);
}